

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void checkPropertyConsistency<char_const*>
               (cmGeneratorTarget *depender,cmGeneratorTarget *dependee,string *propName,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *emitted,string *config,CompatibleType t,char **param_7)

{
  cmLocalGenerator *this;
  pointer pbVar1;
  bool bVar2;
  char *__s;
  string *psVar3;
  ostream *poVar4;
  string *psVar5;
  pointer __v;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  string pdir;
  string local_228;
  string pfile;
  string pname;
  string local_1c8;
  ostringstream e;
  
  psVar5 = config;
  __s = cmGeneratorTarget::GetProperty(dependee,propName);
  if (__s != (char *)0x0) {
    props.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    props.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    props.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&e,__s,(allocator<char> *)&pdir);
    cmSystemTools::ExpandListArgument((string *)&e,&props,false);
    std::__cxx11::string::~string((string *)&e);
    psVar3 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
    std::__cxx11::string::string((string *)&pdir,(string *)psVar3);
    std::__cxx11::string::append((char *)&pdir);
    pbVar1 = props.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__v = props.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; __v != pbVar1; __v = __v + 1) {
      std::__cxx11::string::string((string *)&local_1c8,(string *)__v);
      cmSystemTools::HelpFileName(&pname,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,&pdir,
                     &pname);
      std::operator+(&pfile,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                     ".rst");
      std::__cxx11::string::~string((string *)&e);
      bVar2 = cmsys::SystemTools::FileExists(&pfile,true);
      if (bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar4 = std::operator<<((ostream *)&e,"Target \"");
        poVar4 = std::operator<<(poVar4,(string *)&dependee->Target->Name);
        poVar4 = std::operator<<(poVar4,"\" has property \"");
        poVar4 = std::operator<<(poVar4,(string *)__v);
        poVar4 = std::operator<<(poVar4,"\" listed in its ");
        poVar4 = std::operator<<(poVar4,(string *)propName);
        poVar4 = std::operator<<(poVar4,
                                 " property.  This is not allowed.  Only user-defined properties may appear listed in the "
                                );
        poVar4 = std::operator<<(poVar4,(string *)propName);
        std::operator<<(poVar4," property.");
        this = depender->LocalGenerator;
        std::__cxx11::stringbuf::str();
        cmLocalGenerator::IssueMessage(this,FATAL_ERROR,&local_228);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
LAB_0022f67c:
        std::__cxx11::string::~string((string *)&pfile);
        std::__cxx11::string::~string((string *)&pname);
        break;
      }
      pVar6 = std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)emitted,__v);
      if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        getLinkInterfaceDependentProperty<char_const*>(depender,__v,config,t,(char **)psVar5);
        bVar2 = cmSystemTools::GetErrorOccuredFlag();
        if (bVar2) goto LAB_0022f67c;
      }
      std::__cxx11::string::~string((string *)&pfile);
      std::__cxx11::string::~string((string *)&pname);
    }
    std::__cxx11::string::~string((string *)&pdir);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&props);
  }
  return;
}

Assistant:

void checkPropertyConsistency(cmGeneratorTarget const* depender,
                              cmGeneratorTarget const* dependee,
                              const std::string& propName,
                              std::set<std::string>& emitted,
                              const std::string& config, CompatibleType t,
                              PropertyType* /*unused*/)
{
  const char* prop = dependee->GetProperty(propName);
  if (!prop) {
    return;
  }

  std::vector<std::string> props;
  cmSystemTools::ExpandListArgument(prop, props);
  std::string pdir = cmSystemTools::GetCMakeRoot();
  pdir += "/Help/prop_tgt/";

  for (std::string const& p : props) {
    std::string pname = cmSystemTools::HelpFileName(p);
    std::string pfile = pdir + pname + ".rst";
    if (cmSystemTools::FileExists(pfile, true)) {
      std::ostringstream e;
      e << "Target \"" << dependee->GetName() << "\" has property \"" << p
        << "\" listed in its " << propName
        << " property.  "
           "This is not allowed.  Only user-defined properties may appear "
           "listed in the "
        << propName << " property.";
      depender->GetLocalGenerator()->IssueMessage(MessageType::FATAL_ERROR,
                                                  e.str());
      return;
    }
    if (emitted.insert(p).second) {
      getLinkInterfaceDependentProperty<PropertyType>(depender, p, config, t,
                                                      nullptr);
      if (cmSystemTools::GetErrorOccuredFlag()) {
        return;
      }
    }
  }
}